

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::RGBFilm::RGBFilm
          (RGBFilm *this,FilmBaseParameters *p,RGBColorSpace *colorSpace,Float maxComponentValue,
          bool writeFP16,Allocator alloc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  Float FVar5;
  SquareMatrix<3> local_a4;
  undefined1 local_80 [80];
  
  FilmBaseParameters::FilmBaseParameters((FilmBaseParameters *)local_80,p);
  FilmBase::FilmBase(&this->super_FilmBase,(FilmBaseParameters *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 0x30));
  this->colorSpace = colorSpace;
  this->maxComponentValue = maxComponentValue;
  this->writeFP16 = writeFP16;
  SquareMatrix<3>::SquareMatrix(&this->outputRGBFromSensorRGB);
  Array2D<pbrt::RGBFilm::Pixel>::Array2D
            (&this->pixels,&p->pixelBounds,(allocator_type)alloc.memoryResource);
  FVar5 = TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
          ::Dispatch<pbrt::FilterHandle::Integral()const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                      *)&(this->super_FilmBase).filter);
  this->filterIntegral = FVar5;
  iVar1 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  iVar2 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar3 = iVar1 - iVar2;
  if ((iVar3 != 0 && iVar2 <= iVar1) &&
     (iVar1 = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>.y,
     iVar2 = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>.y,
     iVar4 = iVar1 - iVar2, iVar4 != 0 && iVar2 <= iVar1)) {
    if (colorSpace != (RGBColorSpace *)0x0) {
      *(long *)(in_FS_OFFSET + -0x558) =
           *(long *)(in_FS_OFFSET + -0x558) + (long)(iVar4 * iVar3) * 0x38;
      pbrt::operator*(&local_a4,&colorSpace->RGBFromXYZ,
                      &((this->super_FilmBase).sensor)->XYZFromSensorRGB);
      (this->outputRGBFromSensorRGB).m[2][2] = local_a4.m[2][2];
      *(undefined8 *)(this->outputRGBFromSensorRGB).m[0] = local_a4.m[0]._0_8_;
      *(undefined8 *)((this->outputRGBFromSensorRGB).m[0] + 2) = local_a4.m._8_8_;
      *(undefined8 *)((this->outputRGBFromSensorRGB).m[1] + 1) = local_a4.m[1]._4_8_;
      *(undefined8 *)(this->outputRGBFromSensorRGB).m[2] = local_a4.m[2]._0_8_;
      return;
    }
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
               ,500,"Check failed: %s",(char (*) [22])0x582106);
  }
  LogFatal<char_const(&)[23]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,499,"Check failed: %s",(char (*) [23])"!pixelBounds.IsEmpty()");
}

Assistant:

RGBFilm::RGBFilm(FilmBaseParameters p, const RGBColorSpace *colorSpace,
                 Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      pixels(p.pixelBounds, alloc),
      colorSpace(colorSpace),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16) {
    filterIntegral = filter.Integral();
    CHECK(!pixelBounds.IsEmpty());
    CHECK(colorSpace != nullptr);
    filmPixelMemory += pixelBounds.Area() * sizeof(Pixel);
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;
}